

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::BitsFunction::~BitsFunction(BitsFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~BitsFunction((BitsFunction *)0x971438);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

BitsFunction() : SystemSubroutine(KnownSystemName::Bits, SubroutineKind::Function) {}